

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

LY_ERR lysp_check_dup_groupings(lysp_ctx *ctx,lysp_module *mod)

{
  lysp_include *plVar1;
  LY_ERR LVar2;
  ly_ht *grps_global;
  lysp_node_grp *plVar3;
  ulong uVar4;
  ulong uVar5;
  
  grps_global = lyht_new(8,8,lysp_id_cmp,(void *)0x0,1);
  for (plVar3 = mod->groupings; plVar3 != (lysp_node_grp *)0x0;
      plVar3 = (plVar3->field_0).field_1.next) {
    LVar2 = lysp_check_dup_grouping(ctx,(lysp_node *)0x0,plVar3,grps_global);
    if (LVar2 != LY_SUCCESS) goto LAB_00162d38;
  }
  uVar5 = 0;
  while( true ) {
    plVar1 = mod->includes;
    if (plVar1 == (lysp_include *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ulong *)(plVar1[-1].rev + 8);
    }
    if (uVar4 <= uVar5) break;
    for (plVar3 = (plVar1[uVar5].submodule)->groupings; plVar3 != (lysp_node_grp *)0x0;
        plVar3 = (plVar3->field_0).field_1.next) {
      LVar2 = lysp_check_dup_grouping(ctx,(lysp_node *)0x0,plVar3,grps_global);
      if (LVar2 != LY_SUCCESS) goto LAB_00162d38;
    }
    uVar5 = uVar5 + 1;
  }
  if ((ctx->grps_nodes).count == 0) {
    LVar2 = LY_SUCCESS;
  }
  else {
    uVar5 = 0;
    do {
      for (plVar3 = lysp_node_groupings((lysp_node *)(ctx->grps_nodes).field_2.dnodes[uVar5]);
          plVar3 != (lysp_node_grp *)0x0; plVar3 = (plVar3->field_0).field_1.next) {
        LVar2 = lysp_check_dup_grouping
                          (ctx,(lysp_node *)(ctx->grps_nodes).field_2.dnodes[uVar5],plVar3,
                           grps_global);
        if (LVar2 != LY_SUCCESS) goto LAB_00162d38;
      }
      uVar5 = uVar5 + 1;
      LVar2 = LY_SUCCESS;
    } while (uVar5 < (ctx->grps_nodes).count);
  }
LAB_00162d38:
  lyht_free(grps_global,(_func_void_void_ptr *)0x0);
  return LVar2;
}

Assistant:

LY_ERR
lysp_check_dup_groupings(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    struct ly_ht *ids_global;
    const struct lysp_node_grp *groupings, *grp_iter;
    LY_ARRAY_COUNT_TYPE u;
    uint32_t i;
    LY_ERR ret = LY_SUCCESS;

    ids_global = lyht_new(LYHT_MIN_SIZE, sizeof(char *), lysp_id_cmp, NULL, 1);
    LY_LIST_FOR(mod->groupings, grp_iter) {
        ret = lysp_check_dup_grouping(ctx, NULL, grp_iter, ids_global);
        LY_CHECK_GOTO(ret, cleanup);
    }
    LY_ARRAY_FOR(mod->includes, u) {
        LY_LIST_FOR(mod->includes[u].submodule->groupings, grp_iter) {
            ret = lysp_check_dup_grouping(ctx, NULL, grp_iter, ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }
    for (i = 0; i < ctx->grps_nodes.count; ++i) {
        groupings = lysp_node_groupings((struct lysp_node *)ctx->grps_nodes.objs[i]);
        LY_LIST_FOR(groupings, grp_iter) {
            ret = lysp_check_dup_grouping(ctx, (struct lysp_node *)ctx->grps_nodes.objs[i], grp_iter, ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ids_global, NULL);
    return ret;
}